

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O2

void gen_poly(blargg_ulong mask,int count,byte_ *out)

{
  uint uVar1;
  ulong uVar2;
  int b;
  int iVar3;
  int bits;
  uint uVar4;
  
  uVar2 = 1;
  do {
    uVar4 = 0;
    iVar3 = 0;
    do {
      uVar1 = (uint)uVar2 & 1;
      uVar4 = uVar4 | uVar1 << ((byte)iVar3 & 0x1f);
      uVar2 = (ulong)(-uVar1 & mask ^ (uint)(uVar2 >> 1));
      iVar3 = iVar3 + 1;
    } while (iVar3 != 8);
    *out = (byte_)uVar4;
    out = out + 1;
    count = count + -1;
  } while (count != 0);
  return;
}

Assistant:

static void gen_poly( blargg_ulong mask, int count, byte* out )
{
	blargg_ulong n = 1;
	do
	{
		int bits = 0;
		int b = 0;
		do
		{
			// implemented using "Galios configuration"
			bits |= (n & 1) << b;
			n = (n >> 1) ^ (mask & (blargg_ulong)-(blargg_long)(n & 1));
		}
		while ( b++ < 7 );
		*out++ = bits;
	}
	while ( --count );
}